

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeFormatter.cpp
# Opt level: O2

void __thiscall
cali::TreeFormatter::TreeFormatterImpl::configure(TreeFormatterImpl *this,QuerySpec *spec)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  const_iterator cVar4;
  ostream *poVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  long lVar6;
  _Rb_tree_header *p_Var7;
  bool ok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [512];
  int local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,"path-attributes",(allocator<char> *)&ok);
  this_00 = &(spec->format).kwargs;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_238);
  std::__cxx11::string::~string((string *)local_238);
  p_Var7 = &(spec->format).kwargs._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar4._M_node != p_Var7) {
    std::__cxx11::string::string((string *)&local_258,(string *)(cVar4._M_node + 2));
    util::
    split<std::__cxx11::string,char,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_258,',',
               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )&this->m_path_key_names);
    std::__cxx11::string::~string((string *)&local_258);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,"column-width",(allocator<char> *)&ok);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_238);
  std::__cxx11::string::~string((string *)local_238);
  if ((_Rb_tree_header *)cVar4._M_node != p_Var7) {
    _ok = _ok & 0xffffffffffffff00;
    std::__cxx11::string::string((string *)local_238,(string *)(cVar4._M_node + 2));
    iVar3 = StringConverter::to_int((StringConverter *)local_238,&ok);
    this->m_max_column_width = iVar3;
    std::__cxx11::string::~string((string *)local_238);
    if (ok == false) {
      std::ofstream::ofstream((Log *)local_238);
      local_38 = 0;
      poVar5 = Log::stream((Log *)local_238);
      poVar5 = std::operator<<(poVar5,"TreeFormatter: invalid column width argument \"");
      poVar5 = std::operator<<(poVar5,(string *)(cVar4._M_node + 2));
      poVar5 = std::operator<<(poVar5,"\"");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::ofstream::~ofstream(local_238);
      this->m_max_column_width = -1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_238,"print-globals",(allocator<char> *)&ok);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_238);
  std::__cxx11::string::~string((string *)local_238);
  if ((_Rb_tree_header *)cVar4._M_node != p_Var7) {
    this->m_print_globals = true;
  }
  local_238._0_8_ = "path";
  local_238._8_8_ = "prop:nested";
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 8) {
    _ok = *(ulong *)(local_238 + lVar6);
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                           ((this->m_path_key_names).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->m_path_key_names).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&ok);
    if (__position._M_current !=
        (this->m_path_key_names).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this->m_use_nested = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&this->m_path_key_names,(const_iterator)__position._M_current);
    }
  }
  pbVar1 = (this->m_path_key_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_path_key_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    this->m_use_nested = false;
  }
  local_238._0_8_ = (pointer)0x0;
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::_M_fill_assign
            (&this->m_path_keys,(long)pbVar2 - (long)pbVar1 >> 5,(value_type *)local_238);
  return;
}

Assistant:

void configure(const QuerySpec& spec)
    {
        // set path keys (first argument in spec.format.args)

        {
            auto it = spec.format.kwargs.find("path-attributes");
            if (it != spec.format.kwargs.end())
                util::split(it->second, ',', std::back_inserter(m_path_key_names));
        }

        // set max column width
        {
            auto it = spec.format.kwargs.find("column-width");
            if (it != spec.format.kwargs.end()) {
                bool ok = false;

                m_max_column_width = StringConverter(it->second).to_int(&ok);

                if (!ok) {
                    Log(0).stream() << "TreeFormatter: invalid column width argument \"" << it->second << "\""
                                    << std::endl;

                    m_max_column_width = -1;
                }
            }
        }

        {
            auto it = spec.format.kwargs.find("print-globals");
            if (it != spec.format.kwargs.end())
                m_print_globals = true;
        }

        {
            for (const auto path_str : { "path", "prop:nested" }) {
                auto it = std::find(m_path_key_names.begin(), m_path_key_names.end(), path_str);

                if (it != m_path_key_names.end()) {
                    m_use_nested = true;
                    m_path_key_names.erase(it);
                }
            }

            if (!m_path_key_names.empty())
                m_use_nested = false;
        }

        m_path_keys.assign(m_path_key_names.size(), Attribute());
    }